

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>>::
write_padded<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>>::str_writer<char>>
          (basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>> *this,format_specs *specs,
          str_writer<char> *f)

{
  size_t n;
  size_t sVar1;
  byte bVar2;
  ulong uVar3;
  ulong uVar4;
  char_type fill;
  wchar_t local_3c;
  checked_ptr<typename_buffer<wchar_t>::value_type> local_38;
  
  uVar3 = (ulong)(uint)specs->width;
  n = f->size_;
  sVar1 = n;
  if (uVar3 != 0) {
    sVar1 = basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>_>::str_writer<char>::width(f);
  }
  uVar4 = uVar3 - sVar1;
  if (uVar3 < sVar1 || uVar4 == 0) {
    local_38 = reserve<duckdb_fmt::v6::internal::buffer<wchar_t>,_0>
                         ((back_insert_iterator<duckdb_fmt::v6::internal::buffer<wchar_t>_> *)this,n
                         );
    str_writer<char>::operator()((str_writer<char> *)f,&local_38);
  }
  else {
    local_38 = reserve<duckdb_fmt::v6::internal::buffer<wchar_t>,_0>
                         ((back_insert_iterator<duckdb_fmt::v6::internal::buffer<wchar_t>_> *)this,
                          (n + uVar3) - sVar1);
    local_3c = (specs->fill).data_[0];
    bVar2 = specs->field_0x9 & 0xf;
    if (bVar2 == 3) {
      local_38 = std::__fill_n_a<wchar_t*,unsigned_long,wchar_t>(local_38,uVar4 >> 1,&local_3c);
      str_writer<char>::operator()((str_writer<char> *)f,&local_38);
      uVar4 = uVar4 - (uVar4 >> 1);
    }
    else {
      if (bVar2 == 2) {
        local_38 = std::__fill_n_a<wchar_t*,unsigned_long,wchar_t>(local_38,uVar4,&local_3c);
        str_writer<char>::operator()((str_writer<char> *)f,&local_38);
        return;
      }
      str_writer<char>::operator()((str_writer<char> *)f,&local_38);
    }
    std::__fill_n_a<wchar_t*,unsigned_long,wchar_t>(local_38,uVar4,&local_3c);
  }
  return;
}

Assistant:

void write_padded(const format_specs& specs, F&& f) {
    // User-perceived width (in code points).
    unsigned width = to_unsigned(specs.width);
    size_t size = f.size();  // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points) return f(reserve(size));
    auto&& it = reserve(width + (size - num_code_points));
    char_type fill = specs.fill[0];
    std::size_t padding = width - num_code_points;
    if (specs.align == align::right) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (specs.align == align::center) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }